

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::anon_unknown_0::AssignDescriptorsImpl(DescriptorTable *table)

{
  Metadata *pMVar1;
  iterator __position;
  Metadata *pMVar2;
  int iVar3;
  DescriptorPool *this;
  FileDescriptor *pFVar4;
  LogMessage *other;
  pthread_mutex_t *ppVar5;
  long lVar6;
  long lVar7;
  pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> local_a0;
  AssignDescriptorsHelper local_90;
  undefined1 *local_60 [2];
  int local_50 [10];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&AssignDescriptorsImpl::mu);
  if (iVar3 == 0) {
    internal::AddDescriptors(table);
    pthread_mutex_unlock((pthread_mutex_t *)&AssignDescriptorsImpl::mu);
    this = DescriptorPool::internal_generated_pool();
    std::__cxx11::string::string((string *)local_60,table->filename,(allocator *)&local_90);
    pFVar4 = DescriptorPool::FindFileByName(this,(string *)local_60);
    if ((int *)local_60[0] != &((LogMessage *)local_60)->line_) {
      operator_delete(local_60[0]);
    }
    if (pFVar4 == (FileDescriptor *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x92a);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_60,"CHECK failed: file != nullptr: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_60);
    }
    local_90.factory_ = MessageFactory::generated_factory();
    local_90.offsets_ = table->offsets;
    local_90.file_level_metadata_ = table->file_level_metadata;
    local_90.file_level_enum_descriptors_ = table->file_level_enum_descriptors;
    local_90.schemas_ = table->schemas;
    local_90.default_instance_data_ = table->default_instances;
    if (0 < *(int *)(pFVar4 + 0x2c)) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        AssignDescriptorsHelper::AssignMessageDescriptor
                  (&local_90,(Descriptor *)(*(long *)(pFVar4 + 0x68) + lVar6));
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x90;
      } while (lVar7 < *(int *)(pFVar4 + 0x2c));
    }
    iVar3 = *(int *)(pFVar4 + 0x30);
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        *local_90.file_level_enum_descriptors_ =
             (EnumDescriptor *)(*(long *)(pFVar4 + 0x70) + lVar6);
        local_90.file_level_enum_descriptors_ = local_90.file_level_enum_descriptors_ + 1;
        lVar6 = lVar6 + 0x50;
      } while ((long)iVar3 * 0x50 != lVar6);
    }
    if ((*(char *)(*(long *)(pFVar4 + 0x88) + 0x9b) == '\x01') &&
       (iVar3 = *(int *)(pFVar4 + 0x34), 0 < (long)iVar3)) {
      lVar6 = 0;
      do {
        table->file_level_service_descriptors[lVar6] =
             (ServiceDescriptor *)(lVar6 * 0x30 + *(long *)(pFVar4 + 0x78));
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar3);
    }
    if ((anonymous_namespace)::MetadataOwner::Instance()::res == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::MetadataOwner::Instance()::res);
      if (iVar3 != 0) {
        ppVar5 = (pthread_mutex_t *)operator_new(0x40);
        *(undefined8 *)((long)ppVar5 + 0x30) = 0;
        *(undefined8 *)((long)ppVar5 + 0x38) = 0;
        (ppVar5->__data).__list.__next = (__pthread_internal_list *)0x0;
        ppVar5[1].__align = 0;
        *(int *)((long)ppVar5 + 0x10) = 0;
        *(int *)((long)ppVar5 + 0x14) = 0;
        (ppVar5->__data).__list.__prev = (__pthread_internal_list *)0x0;
        ppVar5->__align = 0;
        *(int *)((long)ppVar5 + 8) = 0;
        *(uint *)((long)ppVar5 + 0xc) = 0;
        internal::OnShutdownRun
                  (internal::
                   OnShutdownDelete<google::protobuf::(anonymous_namespace)::MetadataOwner>::
                   anon_class_1_0_00000001::__invoke,ppVar5);
        (anonymous_namespace)::MetadataOwner::Instance()::res = ppVar5;
        __cxa_guard_release(&(anonymous_namespace)::MetadataOwner::Instance()::res);
      }
    }
    pMVar2 = local_90.file_level_metadata_;
    ppVar5 = (anonymous_namespace)::MetadataOwner::Instance()::res;
    pMVar1 = table->file_level_metadata;
    iVar3 = pthread_mutex_lock((anonymous_namespace)::MetadataOwner::Instance()::res);
    if (iVar3 == 0) {
      local_a0.second = pMVar2;
      __position._M_current =
           *(pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> **)
            ((long)ppVar5 + 0x30);
      local_a0.first = pMVar1;
      if (__position._M_current ==
          *(pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> **)
           ((long)ppVar5 + 0x38)) {
        std::
        vector<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>,std::allocator<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>>
        ::
        _M_realloc_insert<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>
                  ((vector<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>,std::allocator<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>>
                    *)&ppVar5[1].__data,__position,&local_a0);
      }
      else {
        (__position._M_current)->first = pMVar1;
        (__position._M_current)->second = pMVar2;
        *(long *)((long)ppVar5 + 0x30) = *(long *)((long)ppVar5 + 0x30) + 0x10;
      }
      pthread_mutex_unlock(ppVar5);
      return;
    }
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  GOOGLE_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(
      factory, table->file_level_metadata, table->file_level_enum_descriptors,
      table->schemas, table->default_instances, table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
  MetadataOwner::Instance()->AddArray(table->file_level_metadata,
                                      helper.GetCurrentMetadataPtr());
}